

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation_binder.cpp
# Opt level: O2

void __thiscall
duckdb::RelationBinder::RelationBinder
          (RelationBinder *this,Binder *binder,ClientContext *context,string *op)

{
  ExpressionBinder::ExpressionBinder(&this->super_ExpressionBinder,binder,context,false);
  (this->super_ExpressionBinder)._vptr_ExpressionBinder =
       (_func_int **)&PTR__RelationBinder_0178b6a0;
  ::std::__cxx11::string::string((string *)&this->op,(string *)op);
  return;
}

Assistant:

RelationBinder::RelationBinder(Binder &binder, ClientContext &context, string op)
    : ExpressionBinder(binder, context), op(std::move(op)) {
}